

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui-ws.cpp
# Opt level: O2

int __thiscall ImGuiWS::init(ImGuiWS *this,EVP_PKEY_CTX *ctx)

{
  _Head_base<0UL,_ImGuiWS::Impl_*,_false> _Var1;
  thread tVar2;
  Parameters PVar3;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *in_RCX;
  string *in_RDX;
  undefined4 uVar4;
  Parameters parameters;
  undefined1 in_stack_fffffffffffffe88 [16];
  undefined8 uVar5;
  undefined8 uVar6;
  code *pcVar7;
  code *pcVar8;
  undefined4 uVar9;
  undefined8 uVar10;
  code *pcVar11;
  code *pcVar12;
  undefined1 auVar13 [32];
  undefined1 in_stack_fffffffffffffed8 [64];
  undefined1 auVar14 [32];
  char local_d8 [32];
  Parameters local_b8;
  
  _Var1._M_head_impl =
       (this->m_impl)._M_t.super___uniq_ptr_impl<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>
       ._M_t.super__Tuple_impl<0UL,_ImGuiWS::Impl_*,_std::default_delete<ImGuiWS::Impl>_>.
       super__Head_base<0UL,_ImGuiWS::Impl_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xfffffffffffffeb8,"my_id[%d]",
             (allocator<char> *)&stack0xfffffffffffffe96);
  Incppect<false>::var((string *)&(_Var1._M_head_impl)->incpp,(function *)&stack0xfffffffffffffeb8);
  std::_Function_base::~_Function_base((_Function_base *)&stack0xfffffffffffffe98);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffeb8);
  _Var1._M_head_impl =
       (this->m_impl)._M_t.super___uniq_ptr_impl<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>
       ._M_t.super__Tuple_impl<0UL,_ImGuiWS::Impl_*,_std::default_delete<ImGuiWS::Impl>_>.
       super__Head_base<0UL,_ImGuiWS::Impl_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xfffffffffffffeb8,"imgui.n_textures",
             (allocator<char> *)&stack0xfffffffffffffe96);
  Incppect<false>::var((string *)&(_Var1._M_head_impl)->incpp,(function *)&stack0xfffffffffffffeb8);
  std::_Function_base::~_Function_base((_Function_base *)&stack0xfffffffffffffe98);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffeb8);
  _Var1._M_head_impl =
       (this->m_impl)._M_t.super___uniq_ptr_impl<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>
       ._M_t.super__Tuple_impl<0UL,_ImGuiWS::Impl_*,_std::default_delete<ImGuiWS::Impl>_>.
       super__Head_base<0UL,_ImGuiWS::Impl_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xfffffffffffffeb8,"imgui.texture_id[%d]",
             (allocator<char> *)&stack0xfffffffffffffe96);
  Incppect<false>::var((string *)&(_Var1._M_head_impl)->incpp,(function *)&stack0xfffffffffffffeb8);
  std::_Function_base::~_Function_base((_Function_base *)&stack0xfffffffffffffe98);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffeb8);
  _Var1._M_head_impl =
       (this->m_impl)._M_t.super___uniq_ptr_impl<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>
       ._M_t.super__Tuple_impl<0UL,_ImGuiWS::Impl_*,_std::default_delete<ImGuiWS::Impl>_>.
       super__Head_base<0UL,_ImGuiWS::Impl_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xfffffffffffffeb8,"imgui.texture_revision[%d]",
             (allocator<char> *)&stack0xfffffffffffffe96);
  Incppect<false>::var((string *)&(_Var1._M_head_impl)->incpp,(function *)&stack0xfffffffffffffeb8);
  std::_Function_base::~_Function_base((_Function_base *)&stack0xfffffffffffffe98);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffeb8);
  _Var1._M_head_impl =
       (this->m_impl)._M_t.super___uniq_ptr_impl<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>
       ._M_t.super__Tuple_impl<0UL,_ImGuiWS::Impl_*,_std::default_delete<ImGuiWS::Impl>_>.
       super__Head_base<0UL,_ImGuiWS::Impl_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xfffffffffffffeb8,"imgui.texture_data[%d]",
             (allocator<char> *)&stack0xfffffffffffffe96);
  Incppect<false>::var((string *)&(_Var1._M_head_impl)->incpp,(function *)&stack0xfffffffffffffeb8);
  std::_Function_base::~_Function_base((_Function_base *)&stack0xfffffffffffffe98);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffeb8);
  _Var1._M_head_impl =
       (this->m_impl)._M_t.super___uniq_ptr_impl<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>
       ._M_t.super__Tuple_impl<0UL,_ImGuiWS::Impl_*,_std::default_delete<ImGuiWS::Impl>_>.
       super__Head_base<0UL,_ImGuiWS::Impl_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xfffffffffffffeb8,"imgui.n_draw_lists",
             (allocator<char> *)&stack0xfffffffffffffe96);
  Incppect<false>::var((string *)&(_Var1._M_head_impl)->incpp,(function *)&stack0xfffffffffffffeb8);
  std::_Function_base::~_Function_base((_Function_base *)&stack0xfffffffffffffe98);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffeb8);
  _Var1._M_head_impl =
       (this->m_impl)._M_t.super___uniq_ptr_impl<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>
       ._M_t.super__Tuple_impl<0UL,_ImGuiWS::Impl_*,_std::default_delete<ImGuiWS::Impl>_>.
       super__Head_base<0UL,_ImGuiWS::Impl_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xfffffffffffffeb8,"imgui.draw_list[%d]",
             (allocator<char> *)&stack0xfffffffffffffe96);
  uVar6 = 0;
  pcVar8 = std::
           _Function_handler<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/src/imgui-ws.cpp:144:46)>
           ::_M_invoke;
  pcVar7 = std::
           _Function_handler<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/src/imgui-ws.cpp:144:46)>
           ::_M_manager;
  uVar5 = this;
  Incppect<false>::var((string *)&(_Var1._M_head_impl)->incpp,(function *)&stack0xfffffffffffffeb8);
  std::_Function_base::~_Function_base((_Function_base *)&stack0xfffffffffffffe98);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffeb8);
  pcVar12 = std::
            _Function_handler<void_(int,_Incppect<false>::EventType,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/src/imgui-ws.cpp:162:27)>
            ::_M_invoke;
  pcVar11 = std::
            _Function_handler<void_(int,_Incppect<false>::EventType,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/src/imgui-ws.cpp:162:27)>
            ::_M_manager;
  Incppect<false>::handler
            ((function *)
             &((this->m_impl)._M_t.
               super___uniq_ptr_impl<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>._M_t.
               super__Tuple_impl<0UL,_ImGuiWS::Impl_*,_std::default_delete<ImGuiWS::Impl>_>.
               super__Head_base<0UL,_ImGuiWS::Impl_*,_false>._M_head_impl)->incpp);
  std::_Function_base::~_Function_base((_Function_base *)&stack0xfffffffffffffeb8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xfffffffffffffeb8,"imgui-ws.js",
             (allocator<char> *)&stack0xfffffffffffffe98);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            (in_RCX,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    &stack0xfffffffffffffeb8);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffeb8);
  _Var1._M_head_impl =
       (this->m_impl)._M_t.super___uniq_ptr_impl<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>
       ._M_t.super__Tuple_impl<0UL,_ImGuiWS::Impl_*,_std::default_delete<ImGuiWS::Impl>_>.
       super__Head_base<0UL,_ImGuiWS::Impl_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xfffffffffffffeb8,"/imgui-ws.js",
             (allocator<char> *)&stack0xfffffffffffffe96);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xfffffffffffffe98,
             "\n\nvar imgui_ws = {\n    canvas: null,\n    gl: null,\n\n    shader_program: null,\n    vertex_buffer: null,\n    index_buffer: null,\n\n    attribute_location_tex: null,\n    attribute_location_proj_mtx: null,\n    attribute_location_position: null,\n    attribute_location_uv: null,\n    attribute_location_color: null,\n\n    device_pixel_ratio: window.device_pixel_ratio || 1,\n\n    tex_map_id: {},\n    tex_map_rev: {},\n    tex_map_abuf: {},\n\n    n_draw_lists: null,\n    draw_lists_abuf: {},\n\n    io: {\n        mouse_x: 0.0,\n        mouse_y: 0.0,\n\n        want_capture_mouse: true,\n        want_capture_keyboard: true,\n    },\n\n    init: function(canvas_name) {\n        this.canvas = document.getElementById(canvas_name);\n\n        var onkeyup = this.canvas_on_keyup.bind(this);\n        var onkeydown = this.canvas_on_keydown.bind(this);\n        var onkeypress = this.canvas_on_keypress.bind(this);\n        var onpointermove = this.canvas_on_pointermove.bind(this);\n        var onpointerdown = this.canvas_on_pointerdown.bind(this);\n        var onpointerup = this.canvas_on_pointerup.bind(this);\n        var onwheel = this.canvas_on_wheel.bind(this);\n        var ontouch = this.canvas_on_touch.bind(this);\n\n        //this.canvas.style.touchAction = \'none\'; // Disable browser handling of all panning and zooming gestures.\n        //this.canvas.addEventListener(\'blur\', this.canvas_on_blur);\n\n        this.canvas.addEventListener(\'keyup\', onkeyup, true);\n        this.canvas.addEventListener(\'keydown\', onkeydown, true);\n        this.canvas.addEventListener(\'keypress\', onkeypress, true);\n\n        this.canvas.addEventListener(\'pointermove\', onpointermove);\n        this.canvas.addEventListener(\'mousemove\', onpointermove);\n\n        this.canvas.addEventListener(\'pointerdown\', onpointerdown);\n        this.canvas.addEventListener(\'mousedown\', onpointerdown);\n\n        this.canvas.addEventListener(\'pointerup\', onpointerup);\n        this.canvas.addEventListener(\'mouseup\', onpointerup);\n\n        this.canvas.addEventListener(\'contextmenu\', function(event) { event...." /* TRUNCATED STRING LITERAL */
             ,(allocator<char> *)&stack0xfffffffffffffe97);
  Incppect<false>::setResource
            ((string *)&(_Var1._M_head_impl)->incpp,(string *)&stack0xfffffffffffffeb8);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffe98);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffeb8);
  Incppect<false>::Parameters::Parameters((Parameters *)&stack0xfffffffffffffeb8);
  uVar4 = SUB84(ctx,0);
  uVar9 = 0x100000;
  uVar10 = 0xffffffffffffffff;
  std::__cxx11::string::operator=((string *)&stack0xfffffffffffffed0,in_RDX);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_move_assign((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&stack0xfffffffffffffef0);
  std::__cxx11::string::assign(&stack0xffffffffffffff08);
  std::__cxx11::string::assign(local_d8);
  Incppect<false>::Parameters::Parameters(&local_b8,(Parameters *)&stack0xfffffffffffffeb8);
  PVar3._16_8_ = uVar5;
  PVar3.portListen = in_stack_fffffffffffffe88._0_4_;
  PVar3.maxPayloadLength_bytes = in_stack_fffffffffffffe88._4_4_;
  PVar3.tLastRequestTimeout_ms = in_stack_fffffffffffffe88._8_8_;
  PVar3.httpRoot._M_dataplus._M_p = (pointer)uVar6;
  PVar3.httpRoot._M_string_length = (size_type)pcVar7;
  PVar3.httpRoot.field_2._M_allocated_capacity = (size_type)pcVar8;
  PVar3.httpRoot.field_2._8_4_ = uVar4;
  PVar3.httpRoot.field_2._12_4_ = uVar9;
  PVar3.resources.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)uVar10;
  PVar3.resources.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)pcVar11;
  PVar3.resources.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pcVar12;
  auVar13 = in_stack_fffffffffffffed8._0_32_;
  auVar14 = in_stack_fffffffffffffed8._32_32_;
  PVar3.sslKey._M_dataplus._M_p = (pointer)auVar13._0_8_;
  PVar3.sslKey._M_string_length = auVar13._8_8_;
  PVar3.sslKey.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )auVar13._16_16_;
  PVar3.sslCert._M_dataplus._M_p = (pointer)auVar14._0_8_;
  PVar3.sslCert._M_string_length = auVar14._8_8_;
  PVar3.sslCert.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )auVar14._16_16_;
  Incppect<false>::runAsync(PVar3);
  std::thread::operator=
            (&((this->m_impl)._M_t.
               super___uniq_ptr_impl<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>._M_t.
               super__Tuple_impl<0UL,_ImGuiWS::Impl_*,_std::default_delete<ImGuiWS::Impl>_>.
               super__Head_base<0UL,_ImGuiWS::Impl_*,_false>._M_head_impl)->worker,
             (thread *)&stack0xfffffffffffffe98);
  std::thread::~thread((thread *)&stack0xfffffffffffffe98);
  Incppect<false>::Parameters::~Parameters(&local_b8);
  tVar2._M_id._M_thread =
       (((this->m_impl)._M_t.
         super___uniq_ptr_impl<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>._M_t.
         super__Tuple_impl<0UL,_ImGuiWS::Impl_*,_std::default_delete<ImGuiWS::Impl>_>.
         super__Head_base<0UL,_ImGuiWS::Impl_*,_false>._M_head_impl)->worker)._M_id;
  Incppect<false>::Parameters::~Parameters((Parameters *)&stack0xfffffffffffffeb8);
  return (int)CONCAT71((int7)((ulong)this >> 8),tVar2._M_id._M_thread != 0);
}

Assistant:

bool ImGuiWS::init(int32_t port, std::string pathHttp, std::vector<std::string> resources) {
    m_impl->incpp.var("my_id[%d]", [](const auto & idxs) {
        static int32_t id;
        id = idxs[0];
        return incppect::view(id);
    });

    // number of textures available
    m_impl->incpp.var("imgui.n_textures", [this](const auto & ) {
        std::shared_lock lock(m_impl->mutex);

        return incppect::view(m_impl->dataRead.textures.size());
    });

    // texture ids
    m_impl->incpp.var("imgui.texture_id[%d]", [this](const auto & idxs) {
        std::shared_lock lock(m_impl->mutex);

        if (m_impl->dataRead.textureIdMap.find(idxs[0]) == m_impl->dataRead.textureIdMap.end()) {
            return std::string_view { };
        }

        return incppect::view(m_impl->dataRead.textureIdMap[idxs[0]]);
    });

    // texture revision
    m_impl->incpp.var("imgui.texture_revision[%d]", [this](const auto & idxs) {
        std::shared_lock lock(m_impl->mutex);

        if (m_impl->dataRead.textures.find(idxs[0]) == m_impl->dataRead.textures.end()) {
            return std::string_view { };
        }

        return incppect::view(m_impl->dataRead.textures[idxs[0]].revision);
    });

    // get texture by id
    m_impl->incpp.var("imgui.texture_data[%d]", [this](const auto & idxs) {
        static std::vector<char> data;
        {
            std::shared_lock lock(m_impl->mutex);
            if (m_impl->dataRead.textures.find(idxs[0]) == m_impl->dataRead.textures.end()) {
                return std::string_view { 0, 0 };
            }
            data.clear();
            std::copy(m_impl->dataRead.textures[idxs[0]].data.data(), m_impl->dataRead.textures[idxs[0]].data.data() + m_impl->dataRead.textures[idxs[0]].data.size(),
                      std::back_inserter(data));
        }

        return std::string_view { data.data(), data.size() };
    });

    // get imgui's draw data
    m_impl->incpp.var("imgui.n_draw_lists", [this](const auto & ) {
        std::shared_lock lock(m_impl->mutex);

        return incppect::view(m_impl->dataRead.drawLists.size());
    });

    m_impl->incpp.var("imgui.draw_list[%d]", [this](const auto & idxs) {
        static std::vector<char> data;
        {
            std::shared_lock lock(m_impl->mutex);

            if (idxs[0] >= (int) m_impl->dataRead.drawLists.size()) {
                return std::string_view { nullptr, 0 };
            }

            data.clear();
            std::copy(m_impl->dataRead.drawLists[idxs[0]].data(),
                      m_impl->dataRead.drawLists[idxs[0]].data() + m_impl->dataRead.drawLists[idxs[0]].size(),
                      std::back_inserter(data));
        }

        return std::string_view { data.data(), data.size() };
    });

    m_impl->incpp.handler([&](int clientId, incppect::EventType etype, std::string_view data) {
        Event event;

        event.clientId = clientId;

        switch (etype) {
            case incppect::Connect:
                {
                    ++m_impl->nConnected;
                    event.type = Event::Connected;
                    std::stringstream ss;
                    { int a = data[0]; if (a < 0) a += 256; ss << a << "."; }
                    { int a = data[1]; if (a < 0) a += 256; ss << a << "."; }
                    { int a = data[2]; if (a < 0) a += 256; ss << a << "."; }
                    { int a = data[3]; if (a < 0) a += 256; ss << a; }
                    event.ip = ss.str();
                    if (m_impl->handlerConnect) {
                        m_impl->handlerConnect();
                    }
                }
                break;
            case incppect::Disconnect:
                {
                    --m_impl->nConnected;
                    event.type = Event::Disconnected;
                    if (m_impl->handlerDisconnect) {
                        m_impl->handlerDisconnect();
                    }
                }
                break;
            case incppect::Custom:
                {
                    std::stringstream ss;
                    ss << data;

                    int type = -1;
                    ss >> type;

                    //printf("Received event %d '%s'\n", type, ss.str().c_str());
                    switch (type) {
                        case 0:
                            {
                                // mouse move
                                event.type = Event::MouseMove;
                                ss >> event.mouse_x >> event.mouse_y;
                                //printf("    mouse %g %g\n", event.mouse_x, event.mouse_y);
                            }
                            break;
                        case 1:
                            {
                                // mouse down
                                event.type = Event::MouseDown;
                                ss >> event.mouse_but >> event.mouse_x >> event.mouse_y;
                                //printf("    mouse %d down\n", event.mouse_but);
                            }
                            break;
                        case 2:
                            {
                                // mouse up
                                event.type = Event::MouseUp;
                                ss >> event.mouse_but >> event.mouse_x >> event.mouse_y;
                                //printf("    mouse %d up\n", event.mouse_but);
                            }
                            break;
                        case 3:
                            {
                                // mouse wheel
                                event.type = Event::MouseWheel;
                                ss >> event.wheel_x >> event.wheel_y;
                            }
                            break;
                        case 4:
                            {
                                // key press
                                event.type = Event::KeyPress;
                                ss >> event.key;
                            }
                            break;
                        case 5:
                            {
                                // key down
                                event.type = Event::KeyDown;
                                ss >> event.key;
                            }
                            break;
                        case 6:
                            {
                                // key up
                                event.type = Event::KeyUp;
                                ss >> event.key;
                            }
                            break;
                        case 7:
                            {
                                // resize
                                event.type = Event::Resize;
                                ss >> event.client_width >> event.client_height;
                            }
                            break;
                        case 8:
                            {
                                // take control
                                event.type = Event::TakeControl;
                            }
                            break;
                        default:
                            {
                                printf("Unknown input received from client: id = %d, type = %d\n", clientId, type);
                                return;
                            }
                            break;
                    };
                }
                break;
        };

        m_impl->events.push(std::move(event));
    });

    resources.push_back("imgui-ws.js");
    m_impl->incpp.setResource("/imgui-ws.js", kImGuiWS_js);

    // start the http/websocket server
    incppect::Parameters parameters;
    parameters.portListen = port;
    parameters.maxPayloadLength_bytes = 1024*1024;
    parameters.tLastRequestTimeout_ms = -1;
    parameters.httpRoot = std::move(pathHttp);
    parameters.resources = std::move(resources);
    parameters.sslKey = "key.pem";
    parameters.sslCert = "cert.pem";
    m_impl->worker = m_impl->incpp.runAsync(parameters);

    return m_impl->worker.joinable();
}